

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadGeometry(OgreXmlSerializer *this,VertexDataXml *dest)

{
  bool bVar1;
  uint32_t uVar2;
  Logger *this_00;
  ostream *poVar3;
  char *local_1b8 [4];
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_198 [376];
  
  uVar2 = ReadAttribute<unsigned_int>(this,"vertexcount");
  (dest->super_IVertexData).count = uVar2;
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[25]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
             (char (*) [25])"  - Reading geometry of ");
  poVar3 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (local_198,(uint *)dest);
  std::operator<<(poVar3," vertices");
  std::__cxx11::stringbuf::str();
  Logger::debug(this_00,local_1b8[0]);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  NextNode_abi_cxx11_(this);
  while( true ) {
    bVar1 = std::operator==(&this->m_currentNodeName,"vertexbuffer");
    if (!bVar1) break;
    ReadGeometryVertexBuffer(this,dest);
  }
  return;
}

Assistant:

void OgreXmlSerializer::ReadGeometry(VertexDataXml *dest)
{
    dest->count = ReadAttribute<uint32_t>("vertexcount");
    ASSIMP_LOG_DEBUG_F( "  - Reading geometry of ", dest->count, " vertices");

    NextNode();
    while(m_currentNodeName == nnVertexBuffer) {
        ReadGeometryVertexBuffer(dest);
    }
}